

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_run_container_andnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  rle16_t rVar1;
  bool bVar2;
  int iVar3;
  bitset_container_t *dest;
  array_container_t *paVar4;
  int local_34;
  rle16_t rle;
  int32_t rlepos;
  bitset_container_t *result;
  container_t **dst_local;
  run_container_t *src_2_local;
  bitset_container_t *src_1_local;
  
  dest = bitset_container_create();
  bitset_container_copy(src_1,dest);
  for (local_34 = 0; local_34 < src_2->n_runs; local_34 = local_34 + 1) {
    rVar1 = src_2->runs[local_34];
    bitset_reset_range(dest->words,(uint)rVar1 & 0xffff,
                       ((uint)rVar1 & 0xffff) + ((uint)rVar1 >> 0x10) + 1);
  }
  iVar3 = bitset_container_compute_cardinality(dest);
  dest->cardinality = iVar3;
  bVar2 = 0x1000 < dest->cardinality;
  if (bVar2) {
    *dst = dest;
  }
  else {
    paVar4 = array_container_from_bitset(dest);
    *dst = paVar4;
    bitset_container_free(dest);
  }
  return bVar2;
}

Assistant:

bool bitset_run_container_andnot(
    const bitset_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    // follows Java implementation
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_1, result);
    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(result->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}